

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O0

int Gia_ManHashLookup(Gia_Man_t *p,Gia_Obj_t *p0,Gia_Obj_t *p1)

{
  int iVar1;
  int iLit1_00;
  int iLit1;
  int iLit0;
  Gia_Obj_t *p1_local;
  Gia_Obj_t *p0_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjToLit(p,p0);
  iLit1_00 = Gia_ObjToLit(p,p1);
  iVar1 = Gia_ManHashLookupInt(p,iVar1,iLit1_00);
  return iVar1;
}

Assistant:

int Gia_ManHashLookup( Gia_Man_t * p, Gia_Obj_t * p0, Gia_Obj_t * p1 )
{
    int iLit0 = Gia_ObjToLit( p, p0 );
    int iLit1 = Gia_ObjToLit( p, p1 );
    return Gia_ManHashLookupInt( p, iLit0, iLit1 );
}